

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

size_t absl::lts_20250127::container_internal::SelectBucketCountForIterRange<char_const*const*>
                 (char **first,char **last,size_t bucket_count)

{
  size_t growth;
  size_t bucket_count_local;
  char **last_local;
  char **first_local;
  
  first_local = (char **)bucket_count;
  if (bucket_count == 0) {
    growth = std::distance<char_const*const*>(first,last);
    first_local = (char **)GrowthToLowerboundCapacity(growth);
  }
  return (size_t)first_local;
}

Assistant:

size_t SelectBucketCountForIterRange(InputIter first, InputIter last,
                                     size_t bucket_count) {
  if (bucket_count != 0) {
    return bucket_count;
  }
  using InputIterCategory =
      typename std::iterator_traits<InputIter>::iterator_category;
  if (std::is_base_of<std::random_access_iterator_tag,
                      InputIterCategory>::value) {
    return GrowthToLowerboundCapacity(
        static_cast<size_t>(std::distance(first, last)));
  }
  return 0;
}